

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::GLSLConstantIntegralExpressionTest::prepareUniforms
          (GLSLConstantIntegralExpressionTest *this,GLuint param_1,ProgramInterface *param_2,
          Program *program,Buffer *param_4)

{
  RenderContext *pRVar1;
  GLSLConstantIntegralExpressionTest *pGVar2;
  int iVar3;
  GLint location;
  GLint location_00;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  allocator<char> local_5d;
  GLint local_5c;
  string local_58;
  GLSLConstantIntegralExpressionTest *local_38;
  Functions *gl;
  
  pRVar1 = ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx;
  iVar3 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,param_1));
  gl = (Functions *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"goku",&local_5d);
  location = Utils::Program::GetUniformLocation(program,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"gohan",&local_5d);
  location_00 = Utils::Program::GetUniformLocation(program,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"goten",&local_5d);
  local_38 = this;
  local_5c = Utils::Program::GetUniformLocation(program,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Utils::Program::Uniform(gl,(Type *)Utils::Type::uint,1,location,prepareUniforms::uniform_data);
  pGVar2 = local_38;
  Utils::Program::Uniform
            (gl,(Type *)Utils::Type::uint,local_38->m_gohan_length,location_00,
             prepareUniforms::uniform_data);
  Utils::Program::Uniform
            (gl,(Type *)Utils::Type::uint,pGVar2->m_goten_length,local_5c,
             prepareUniforms::uniform_data);
  return;
}

Assistant:

void GLSLConstantIntegralExpressionTest::prepareUniforms(GLuint /* test_case_index */,
														 Utils::ProgramInterface& /* program_interface */,
														 Utils::Program& program, Utils::Buffer& /* cs_buffer */)
{
	static const GLuint uniform_data[16] = { 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1, 1 };

	const Functions& gl = m_context.getRenderContext().getFunctions();

	GLint goku_location  = program.GetUniformLocation("goku");
	GLint gohan_location = program.GetUniformLocation("gohan");
	GLint goten_location = program.GetUniformLocation("goten");

	program.Uniform(gl, Utils::Type::uint, 1 /* count */, goku_location, uniform_data);
	program.Uniform(gl, Utils::Type::uint, m_gohan_length, gohan_location, uniform_data);
	program.Uniform(gl, Utils::Type::uint, m_goten_length, goten_location, uniform_data);
}